

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O3

void __thiscall
xLearn::FFMScore::calc_grad_ftrl(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  real_t *prVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  real_t *prVar9;
  undefined8 uVar10;
  float fVar11;
  bool bVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  pointer pNVar17;
  pointer pNVar18;
  int iVar19;
  pointer pNVar20;
  ulong uVar21;
  ulong uVar22;
  pointer pNVar23;
  ulong uVar24;
  ulong uVar25;
  pointer pNVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  float fVar30;
  float fVar31;
  real_t rVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar32;
  undefined1 auVar37 [16];
  float fVar33;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar47 [16];
  
  auVar42._4_60_ = in_register_00001244;
  auVar42._0_4_ = norm;
  if (norm < 0.0) {
    fVar33 = sqrtf(norm);
  }
  else {
    auVar38 = vsqrtss_avx(auVar42._0_16_,auVar42._0_16_);
    fVar33 = auVar38._0_4_;
  }
  auVar38 = in_ZMM6._0_16_;
  uVar6 = model->num_field_;
  uVar7 = model->num_feat_;
  pNVar23 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pNVar18 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar23 != pNVar18) {
    prVar9 = model->param_w_;
    do {
      uVar8 = pNVar23->feat_id;
      if (uVar8 < uVar7) {
        uVar13 = uVar8 * 3;
        uVar28 = uVar8 * 3 + 1;
        fVar32 = prVar9[uVar28];
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(pg * pNVar23->feat_val * fVar33)),
                                  ZEXT416((uint)(this->super_Score).lambda_2_),
                                  ZEXT416((uint)prVar9[uVar13]));
        auVar38 = vfmadd213ss_fma(auVar36,auVar36,ZEXT416((uint)fVar32));
        fVar30 = auVar38._0_4_;
        prVar9[uVar28] = fVar30;
        if (fVar30 < 0.0) {
          fVar30 = sqrtf(fVar30);
        }
        else {
          auVar38 = vsqrtss_avx(auVar38,auVar38);
          fVar30 = auVar38._0_4_;
        }
        if (fVar32 < 0.0) {
          fVar32 = sqrtf(fVar32);
        }
        else {
          auVar38 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
          fVar32 = auVar38._0_4_;
        }
        auVar38._0_4_ = (fVar30 - fVar32) / (this->super_Score).alpha_;
        auVar38._4_12_ = SUB6012((undefined1  [60])0x0,0);
        uVar8 = uVar8 * 3 + 2;
        auVar38 = vfnmadd231ss_fma(ZEXT416(auVar36._0_4_),auVar38,ZEXT416((uint)prVar9[uVar13]));
        fVar30 = auVar38._0_4_ + prVar9[uVar8];
        auVar36 = ZEXT816(0);
        uVar10 = vcmpss_avx512f(auVar36,ZEXT416((uint)fVar30),1);
        bVar12 = (bool)((byte)uVar10 & 1);
        prVar9[uVar8] = fVar30;
        fVar32 = (this->super_Score).lambda_1_;
        fVar11 = (float)((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x40800000);
        if (fVar32 < fVar30 * fVar11) {
          fVar31 = prVar9[uVar28];
          fVar4 = (this->super_Score).beta_;
          if (fVar31 < 0.0) {
            fVar31 = sqrtf(fVar31);
          }
          else {
            auVar38 = vsqrtss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
            fVar31 = auVar38._0_4_;
          }
          auVar38 = vfmsub213ss_fma(ZEXT416((uint)fVar32),ZEXT416((uint)fVar11),
                                    ZEXT416((uint)fVar30));
          auVar36._0_4_ =
               auVar38._0_4_ /
               ((fVar4 + fVar31) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
          auVar36._4_12_ = auVar38._4_12_;
        }
        prVar9[uVar13] = auVar36._0_4_;
        pNVar18 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      auVar38 = in_ZMM6._0_16_;
      pNVar23 = pNVar23 + 1;
    } while (pNVar23 != pNVar18);
  }
  prVar9 = model->param_b_;
  fVar33 = prVar9[1];
  auVar36 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar33));
  fVar32 = auVar36._0_4_;
  prVar9[1] = fVar32;
  if (fVar32 < 0.0) {
    fVar32 = sqrtf(fVar32);
  }
  else {
    auVar36 = vsqrtss_avx(auVar36,auVar36);
    fVar32 = auVar36._0_4_;
  }
  if (fVar33 < 0.0) {
    fVar33 = sqrtf(fVar33);
  }
  else {
    auVar36 = vsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
    fVar33 = auVar36._0_4_;
  }
  auVar37._0_4_ = (fVar32 - fVar33) / (this->super_Score).alpha_;
  auVar37._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar36 = vfnmadd132ss_fma(auVar37,ZEXT416((uint)pg),ZEXT416((uint)*prVar9));
  auVar40._0_12_ = ZEXT812(0);
  auVar40._12_4_ = 0;
  fVar32 = auVar36._0_4_ + prVar9[2];
  uVar10 = vcmpss_avx512f(auVar40,ZEXT416((uint)fVar32),1);
  bVar12 = (bool)((byte)uVar10 & 1);
  prVar9[2] = fVar32;
  fVar33 = (this->super_Score).lambda_1_;
  fVar30 = (float)((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x40800000);
  if (fVar33 < fVar32 * fVar30) {
    auVar36 = vfmsub213ss_fma(ZEXT416((uint)fVar33),ZEXT416((uint)fVar30),ZEXT416((uint)fVar32));
    fVar33 = prVar9[1];
    fVar32 = (this->super_Score).beta_;
    if (fVar33 < 0.0) {
      fVar33 = sqrtf(fVar33);
      auVar36 = ZEXT416(auVar36._0_4_);
    }
    else {
      auVar37 = vsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
      fVar33 = auVar37._0_4_;
    }
    auVar40._0_4_ =
         auVar36._0_4_ /
         ((fVar32 + fVar33) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
    auVar40._4_12_ = auVar36._4_12_;
  }
  *prVar9 = auVar40._0_4_;
  pNVar23 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pNVar18 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar23 != pNVar18) {
    auVar38 = vcvtusi2ss_avx512f(auVar38,model->num_K_);
    rVar34 = (this->super_Score).alpha_;
    auVar43._4_4_ = rVar34;
    auVar43._0_4_ = rVar34;
    auVar43._8_4_ = rVar34;
    auVar43._12_4_ = rVar34;
    fVar33 = (this->super_Score).lambda_2_;
    auVar38 = ZEXT416((uint)(auVar38._0_4_ * 0.25));
    auVar38 = vroundss_avx(auVar38,auVar38,10);
    iVar19 = vcvttss2usi_avx512f(auVar38);
    uVar8 = iVar19 * 0xc;
    iVar19 = model->num_field_ * uVar8;
    prVar9 = model->param_v_;
    do {
      if ((pNVar23->field_id < uVar6 && pNVar23->feat_id < uVar7) && (pNVar23 + 1 != pNVar18)) {
        uVar22 = (ulong)(pNVar23->feat_id * iVar19);
        uVar24 = (ulong)(pNVar23->field_id * uVar8);
        fVar32 = pNVar23->feat_val;
        pNVar17 = pNVar23 + 1;
        pNVar26 = pNVar23;
        do {
          pNVar20 = pNVar17;
          if ((pNVar26[1].field_id < uVar6 && pNVar26[1].feat_id < uVar7) && (uVar8 != 0)) {
            uVar21 = (ulong)(pNVar26[1].field_id * uVar8);
            uVar25 = (ulong)(pNVar26[1].feat_id * iVar19);
            uVar29 = 0;
            fVar30 = fVar32 * pNVar26[1].feat_val * norm * pg;
            do {
              pfVar3 = prVar9 + uVar24 + uVar25 + uVar29;
              fVar11 = *pfVar3;
              fVar31 = pfVar3[1];
              fVar4 = pfVar3[2];
              fVar35 = pfVar3[3];
              auVar38 = *(undefined1 (*) [16])(prVar9 + uVar24 + uVar25 + uVar29 + 4);
              lVar27 = -4;
              pfVar3 = prVar9 + uVar22 + uVar21 + uVar29;
              fVar5 = *pfVar3;
              fVar14 = pfVar3[1];
              fVar15 = pfVar3[2];
              fVar16 = pfVar3[3];
              auVar36 = *(undefined1 (*) [16])(prVar9 + uVar22 + uVar21 + uVar29 + 4);
              auVar44._0_4_ = fVar33 * fVar5 + fVar30 * fVar11;
              auVar44._4_4_ = fVar33 * fVar14 + fVar30 * fVar31;
              auVar44._8_4_ = fVar33 * fVar15 + fVar30 * fVar4;
              auVar44._12_4_ = fVar33 * fVar16 + fVar30 * fVar35;
              auVar45._0_4_ = fVar30 * fVar5 + fVar33 * fVar11;
              auVar45._4_4_ = fVar30 * fVar14 + fVar33 * fVar31;
              auVar45._8_4_ = fVar30 * fVar15 + fVar33 * fVar4;
              auVar45._12_4_ = fVar30 * fVar16 + fVar33 * fVar35;
              auVar46._0_4_ = auVar36._0_4_ + auVar44._0_4_ * auVar44._0_4_;
              auVar46._4_4_ = auVar36._4_4_ + auVar44._4_4_ * auVar44._4_4_;
              auVar46._8_4_ = auVar36._8_4_ + auVar44._8_4_ * auVar44._8_4_;
              auVar46._12_4_ = auVar36._12_4_ + auVar44._12_4_ * auVar44._12_4_;
              auVar36 = vsqrtps_avx(auVar36);
              auVar37 = vsqrtps_avx(auVar46);
              auVar37 = vsubps_avx(auVar37,auVar36);
              auVar47._0_4_ = auVar38._0_4_ + auVar45._0_4_ * auVar45._0_4_;
              auVar47._4_4_ = auVar38._4_4_ + auVar45._4_4_ * auVar45._4_4_;
              auVar47._8_4_ = auVar38._8_4_ + auVar45._8_4_ * auVar45._8_4_;
              auVar47._12_4_ = auVar38._12_4_ + auVar45._12_4_ * auVar45._12_4_;
              auVar36 = vsqrtps_avx(auVar38);
              auVar38 = vdivps_avx(auVar37,auVar43);
              auVar37 = vsqrtps_avx(auVar47);
              auVar39._0_4_ = fVar5 * auVar38._0_4_;
              auVar39._4_4_ = fVar14 * auVar38._4_4_;
              auVar39._8_4_ = fVar15 * auVar38._8_4_;
              auVar39._12_4_ = fVar16 * auVar38._12_4_;
              auVar40 = vsubps_avx(auVar44,auVar39);
              pfVar3 = prVar9 + uVar22 + uVar21 + uVar29 + 8;
              fVar5 = pfVar3[1];
              fVar14 = pfVar3[2];
              fVar15 = pfVar3[3];
              auVar38 = vsubps_avx(auVar37,auVar36);
              auVar38 = vdivps_avx(auVar38,auVar43);
              auVar41._0_4_ = fVar11 * auVar38._0_4_;
              auVar41._4_4_ = fVar31 * auVar38._4_4_;
              auVar41._8_4_ = fVar4 * auVar38._8_4_;
              auVar41._12_4_ = fVar35 * auVar38._12_4_;
              auVar38 = vsubps_avx(auVar45,auVar41);
              pfVar1 = prVar9 + uVar24 + uVar25 + uVar29 + 8;
              fVar11 = *pfVar1;
              fVar31 = pfVar1[1];
              fVar4 = pfVar1[2];
              fVar35 = pfVar1[3];
              prVar2 = prVar9 + uVar22 + uVar21 + uVar29 + 8;
              *prVar2 = auVar40._0_4_ + *pfVar3;
              prVar2[1] = auVar40._4_4_ + fVar5;
              prVar2[2] = auVar40._8_4_ + fVar14;
              prVar2[3] = auVar40._12_4_ + fVar15;
              prVar2 = prVar9 + uVar24 + uVar25 + uVar29 + 8;
              *prVar2 = auVar38._0_4_ + fVar11;
              prVar2[1] = auVar38._4_4_ + fVar31;
              prVar2[2] = auVar38._8_4_ + fVar4;
              prVar2[3] = auVar38._12_4_ + fVar35;
              *(undefined1 (*) [16])(prVar9 + uVar22 + uVar21 + uVar29 + 4) = auVar46;
              *(undefined1 (*) [16])(prVar9 + uVar24 + uVar25 + uVar29 + 4) = auVar47;
              do {
                fVar11 = prVar9[uVar22 + uVar21 + uVar29 + lVar27 + 0xc];
                auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
                fVar31 = (this->super_Score).lambda_1_;
                uVar10 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar11),1);
                bVar12 = (bool)((byte)uVar10 & 1);
                fVar4 = (float)((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x40800000);
                rVar34 = 0.0;
                if (fVar31 < fVar11 * fVar4) {
                  fVar35 = prVar9[uVar22 + uVar21 + uVar29 + lVar27 + 8];
                  fVar5 = (this->super_Score).beta_;
                  if (fVar35 < 0.0) {
                    fVar35 = sqrtf(fVar35);
                    auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar38 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
                    fVar35 = auVar38._0_4_;
                  }
                  auVar38 = vfmsub213ss_fma(ZEXT416((uint)fVar31),ZEXT416((uint)fVar4),
                                            ZEXT416((uint)fVar11));
                  rVar34 = auVar38._0_4_ /
                           ((fVar5 + fVar35) / (this->super_Score).alpha_ +
                           (this->super_Score).lambda_2_);
                }
                prVar9[uVar22 + uVar21 + uVar29 + lVar27 + 4] = rVar34;
                fVar11 = prVar9[uVar24 + uVar25 + uVar29 + lVar27 + 0xc];
                fVar31 = (this->super_Score).lambda_1_;
                uVar10 = vcmpss_avx512f(auVar42._0_16_,ZEXT416((uint)fVar11),1);
                bVar12 = (bool)((byte)uVar10 & 1);
                fVar4 = (float)((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x40800000);
                if (fVar31 < fVar11 * fVar4) {
                  fVar35 = prVar9[uVar24 + uVar25 + uVar29 + lVar27 + 8];
                  fVar5 = (this->super_Score).beta_;
                  if (fVar35 < 0.0) {
                    fVar35 = sqrtf(fVar35);
                  }
                  else {
                    auVar38 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
                    fVar35 = auVar38._0_4_;
                  }
                  auVar38 = vfmsub213ss_fma(ZEXT416((uint)fVar31),ZEXT416((uint)fVar4),
                                            ZEXT416((uint)fVar11));
                  auVar42 = ZEXT1664(CONCAT124(auVar38._4_12_,
                                               auVar38._0_4_ /
                                               ((fVar5 + fVar35) / (this->super_Score).alpha_ +
                                               (this->super_Score).lambda_2_)));
                }
                prVar9[uVar24 + uVar25 + uVar29 + lVar27 + 4] = auVar42._0_4_;
                lVar27 = lVar27 + 1;
              } while (lVar27 != 0);
              uVar28 = (int)uVar29 + 0xc;
              uVar29 = (ulong)uVar28;
            } while (uVar28 < uVar8);
            pNVar18 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          }
          pNVar17 = pNVar20 + 1;
          pNVar26 = pNVar20;
        } while (pNVar17 != pNVar18);
      }
      pNVar23 = pNVar23 + 1;
    } while (pNVar23 != pNVar18);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_ftrl(const SparseRow* row,
                              Model& model,
                              real_t pg,
                              real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/  
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = 3 * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * 3;
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        real_t *wg1 = w1 + kAlign;
        real_t *wg2 = w2 + kAlign;
        real_t *z1 = w1 + kAlign * 2;
        real_t *z2 = w2 + kAlign * 2;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMwg1 = _mm_load_ps(wg1);
        __m128 XMMwg2 = _mm_load_ps(wg2);
        __m128 XMMz1 = _mm_load_ps(z1);
        __m128 XMMz2 = _mm_load_ps(z2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        __m128 XMMsigma1 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg1,
                           _mm_mul_ps(XMMg1, XMMg1))),
                           _mm_sqrt_ps(XMMwg1)), XMMalpha);
        __m128 XMMsigma2 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg2,
                           _mm_mul_ps(XMMg2, XMMg2))),
                           _mm_sqrt_ps(XMMwg2)), XMMalpha);
        XMMz1 = _mm_add_ps(XMMz1,
                _mm_sub_ps(XMMg1,
                _mm_mul_ps(XMMsigma1, XMMw1)));
        XMMz2 = _mm_add_ps(XMMz2,
                _mm_sub_ps(XMMg2,
                _mm_mul_ps(XMMsigma2, XMMw2)));
        _mm_store_ps(z1, XMMz1);
        _mm_store_ps(z2, XMMz2);
        XMMwg1 = _mm_add_ps(XMMwg1,
                 _mm_mul_ps(XMMg1, XMMg1));
        XMMwg2 = _mm_add_ps(XMMwg2,
                 _mm_mul_ps(XMMg2, XMMg2));
        _mm_store_ps(wg1, XMMwg1);
        _mm_store_ps(wg2, XMMwg2);
        // Update w. SSE may not faster
        for (size_t i = 0; i < kAlign; ++i) {
          // w1
          real_t z1_value = *(z1+i);
          int sign = z1_value > 0 ? 1 : -1;
          if (sign * z1_value <= lambda_1_) {
            *(w1+i) = 0;
          } else {
            *(w1+i) = (sign*lambda_1_-z1_value) / 
              ((beta_ + sqrt(*(wg1+i))) / alpha_ + lambda_2_);
          }
          // w2
          real_t z2_value = *(z2+i);
          sign = z2_value > 0 ? 1 : -1;
          if (sign * z2_value <= lambda_1_) {
            *(w2+i) = 0;
          } else {
            *(w2+i) = (sign*lambda_1_-z2_value) / 
              ((beta_ + sqrt(*(wg2+i))) / alpha_ + lambda_2_);
          }
        }
      }
    }
  }
}